

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

void __thiscall
VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>::typed_option
          (typed_option<std::vector<char,_std::allocator<char>_>_> *this,
          typed_option<std::vector<char,_std::allocator<char>_>_> *param_1)

{
  config::base_option::base_option(&this->super_base_option,&param_1->super_base_option);
  (this->super_base_option)._vptr_base_option = (_func_int **)&PTR__typed_option_002b6ae0;
  this->m_location = param_1->m_location;
  std::__shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->m_value).
                super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ,&(param_1->m_value).
                 super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              );
  std::__shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->m_default_value).
                super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ,&(param_1->m_default_value).
                 super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              );
  return;
}

Assistant:

typed_option(const std::string& name, T& location) : base_option(name, typeid(T).hash_code()), m_location{location} {}